

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

bool __thiscall Clasp::Solver::endStep(Solver *this,uint32 top,SolverParams *params)

{
  uint uVar1;
  Literal p;
  bool bVar2;
  bool bVar3;
  PostPropagator *pPVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 local_41;
  Antecedent local_40;
  Solver *local_38;
  
  this->field_0x207 = this->field_0x207 & 0x7f;
  bVar2 = popRootLevel(this,(this->levels_).root,(LitVec *)0x0,true);
  if (!bVar2) {
    return bVar2;
  }
  popAuxVar(this,0xffffffff,(ConstraintDB *)0x0);
  uVar1 = (this->shared_->step_).rep_;
  uVar5 = *(uint *)&this->field_0x204 & 0x3fffffff;
  uVar7 = (ulong)uVar5;
  if (top <= uVar5) {
    uVar7 = (ulong)top;
  }
  pPVar4 = PropagatorList::find(&this->post_,0x3ff);
  if (pPVar4 != (PostPropagator *)0x0) {
    (*(pPVar4->super_Constraint)._vptr_Constraint[5])(pPVar4,this,1);
  }
  if ((*(byte *)((long)(this->assign_).assign_.ebo_.buf + (ulong)(uVar1 & 0xfffffffc)) & 3) == 0) {
    local_40.data_ = 2;
    bVar3 = force(this,(Literal)(uVar1 & 0xfffffffe ^ 2),0,&local_40,0xffffffff);
    if (!bVar3) goto LAB_00168ea6;
  }
  bVar3 = simplify(this);
  if ((((bVar3) && (*(this->shared_->solvers_).ebo_.buf != this)) &&
      (bVar3 = SharedContext::ok(this->shared_), bVar3)) &&
     (uVar5 = (this->assign_).trail.ebo_.size, (uint)uVar7 < uVar5)) {
    local_38 = *(this->shared_->solvers_).ebo_.buf;
    do {
      p.rep_ = (this->assign_).trail.ebo_.buf[uVar7].rep_;
      if (p.rep_ >> 2 != uVar1 >> 2) {
        local_40.data_ = 2;
        bVar3 = force(local_38,p,0,&local_40,0xffffffff);
        if (!bVar3) break;
      }
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
    } while (uVar6 < uVar5);
  }
LAB_00168ea6:
  if ((params->field_0x1b & 1) != 0) {
    local_40.data_._0_4_ = 0x25800;
    reduceLearnts(this,1.0,(ReduceStrategy *)&local_40);
  }
  if ((params->field_0x1a & 0x20) != 0) {
    resetHeuristic(this,this,(DecisionHeuristic *)0x0,Acquire);
  }
  if ((params->field_0x1a & 0x40) != 0) {
    uVar1 = (this->assign_).pref_.ebo_.size;
    local_40.data_ = (uint64)&local_41;
    local_41 = 0;
    (this->assign_).pref_.ebo_.size = 0;
    bk_lib::pod_vector<Clasp::ValueSet,std::allocator<Clasp::ValueSet>>::
    insert_impl<unsigned_int,bk_lib::detail::Fill<Clasp::ValueSet>>
              ((pod_vector<Clasp::ValueSet,std::allocator<Clasp::ValueSet>> *)&(this->assign_).pref_
               ,(this->assign_).pref_.ebo_.buf,uVar1,(Fill<Clasp::ValueSet> *)&local_40);
  }
  if (((params->field_0x1a & 0x80) != 0) && (uVar7 = (ulong)(this->learnts_).ebo_.size, uVar7 != 0))
  {
    uVar8 = 0;
    do {
      (*(this->learnts_).ebo_.buf[uVar8]->_vptr_Constraint[0xe])();
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  return bVar2;
}

Assistant:

bool Solver::endStep(uint32 top, const SolverParams& params) {
	initPost_ = 0; // defer calls to PostPropagator::init()
	if (!popRootLevel(rootLevel())) { return false; }
	popAuxVar();
	Literal x = shared_->stepLiteral();
	top = std::min(top, (uint32)lastSimp_);
	if (PostPropagator* pp = getPost(PostPropagator::priority_reserved_look)) {
		pp->destroy(this, true);
	}
	if ((value(x.var()) != value_free || force(~x)) && simplify() && this != shared_->master() && shared_->ok()) {
		Solver& m = *shared_->master();
		for (uint32 end = (uint32)assign_.trail.size(); top < end; ++top) {
			Literal u = assign_.trail[top];
			if (u.var() != x.var() && !m.force(u)) { break; }
		}
	}
	if (params.forgetLearnts())   { reduceLearnts(1.0f); }
	if (params.forgetHeuristic()) { resetHeuristic(this); }
	if (params.forgetSigns())     { resetPrefs(); }
	if (params.forgetActivities()){ resetLearntActivities(); }
	return true;
}